

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# managedheap.cpp
# Opt level: O0

BytePtr __thiscall stackjit::ManagedHeap::allocate(ManagedHeap *this,size_t size)

{
  BytePtr puVar1;
  BytePtr puVar2;
  BytePtr allocation;
  BytePtr nextAllocation;
  size_t size_local;
  ManagedHeap *this_local;
  
  puVar1 = this->mNextAllocation;
  puVar2 = end(this);
  if (puVar2 < puVar1 + size) {
    this_local = (ManagedHeap *)0x0;
  }
  else {
    this_local = (ManagedHeap *)this->mNextAllocation;
    this->mNextAllocation = puVar1 + size;
  }
  return (BytePtr)this_local;
}

Assistant:

BytePtr ManagedHeap::allocate(std::size_t size) {
		auto nextAllocation = mNextAllocation + size;

		if (nextAllocation <= end()) {
			auto allocation = mNextAllocation;
			mNextAllocation = nextAllocation;
			return allocation;
		} else {
			return nullptr;
		}
	}